

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

void __thiscall FConfigFile::FConfigFile(FConfigFile *this,char *pathname)

{
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_006f6280;
  (this->PathName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  this->CurrentSection = (FConfigSection *)0x0;
  this->CurrentEntry = (FConfigEntry *)0x0;
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  FString::operator=(&this->PathName,pathname);
  LoadConfigFile(this);
  this->OkayToWrite = true;
  this->FileExisted = true;
  return;
}

Assistant:

FConfigFile::FConfigFile (const char *pathname)
{
	Sections = CurrentSection = NULL;
	LastSectionPtr = &Sections;
	CurrentEntry = NULL;
	ChangePathName (pathname);
	LoadConfigFile ();
	OkayToWrite = true;
	FileExisted = true;
}